

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall Liby::EventLoop::EventLoop(EventLoop *this,string *chooser)

{
  _Head_base<0UL,_Liby::Poller_*,_false> _Var1;
  _Head_base<0UL,_Liby::EventQueue_*,_false> _Var2;
  bool bVar3;
  _Head_base<0UL,_Liby::EventQueue_*,_false> local_40;
  Poller *local_38;
  
  *(undefined8 *)((long)&(this->rf1_).super__Function_base._M_functor + 8) = 0;
  (this->rf1_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->rf_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->rf1_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->rf_).super__Function_base._M_functor + 8) = 0;
  (this->rf_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->tqueue_)._M_t.
  super___uniq_ptr_impl<Liby::TimerQueue,_std::default_delete<Liby::TimerQueue>_>._M_t.
  super__Tuple_impl<0UL,_Liby::TimerQueue_*,_std::default_delete<Liby::TimerQueue>_>.
  super__Head_base<0UL,_Liby::TimerQueue_*,_false>._M_head_impl = (TimerQueue *)0x0;
  *(undefined8 *)&(this->rf_).super__Function_base._M_functor = 0;
  (this->poller_)._M_t.super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>._M_t.
  super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
  super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl = (Poller *)0x0;
  (this->equeue_)._M_t.
  super___uniq_ptr_impl<Liby::EventQueue,_std::default_delete<Liby::EventQueue>_>._M_t.
  super__Tuple_impl<0UL,_Liby::EventQueue_*,_std::default_delete<Liby::EventQueue>_>.
  super__Head_base<0UL,_Liby::EventQueue_*,_false>._M_head_impl = (EventQueue *)0x0;
  (this->rf1_)._M_invoker = (_Invoker_type)0x0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::_Deque_base
            (&(this->nextLoopHandlers_).
              super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::_Deque_base
            (&(this->afterLoopHandlers_).
              super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  bVar3 = std::operator==(chooser,"POLL");
  if (bVar3) {
    std::make_unique<Liby::PollerPoll>();
    _Var2._M_head_impl = local_40._M_head_impl;
    local_40._M_head_impl = (pointer)0x0;
    _Var1._M_head_impl =
         (this->poller_)._M_t.
         super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>._M_t.
         super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
         super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl;
    (this->poller_)._M_t.super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>.
    _M_t.super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
    super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl = (Poller *)_Var2._M_head_impl;
    if (_Var1._M_head_impl != (Poller *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_Poller + 8))();
    }
    std::unique_ptr<Liby::PollerPoll,_std::default_delete<Liby::PollerPoll>_>::~unique_ptr
              ((unique_ptr<Liby::PollerPoll,_std::default_delete<Liby::PollerPoll>_> *)&local_40);
  }
  else {
    bVar3 = std::operator==(chooser,"SELECT");
    if (bVar3) {
      std::make_unique<Liby::PollerSelect>();
      _Var2._M_head_impl = local_40._M_head_impl;
      local_40._M_head_impl = (pointer)0x0;
      _Var1._M_head_impl =
           (this->poller_)._M_t.
           super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>._M_t.
           super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
           super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl;
      (this->poller_)._M_t.super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>.
      _M_t.super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
      super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl = (Poller *)_Var2._M_head_impl;
      if (_Var1._M_head_impl != (Poller *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_Poller + 8))();
      }
      std::unique_ptr<Liby::PollerSelect,_std::default_delete<Liby::PollerSelect>_>::~unique_ptr
                ((unique_ptr<Liby::PollerSelect,_std::default_delete<Liby::PollerSelect>_> *)
                 &local_40);
    }
    else {
      std::make_unique<Liby::PollerEpoll>();
      _Var2._M_head_impl = local_40._M_head_impl;
      local_40._M_head_impl = (pointer)0x0;
      _Var1._M_head_impl =
           (this->poller_)._M_t.
           super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>._M_t.
           super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
           super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl;
      (this->poller_)._M_t.super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>.
      _M_t.super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
      super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl = (Poller *)_Var2._M_head_impl;
      if (_Var1._M_head_impl != (Poller *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_Poller + 8))();
        if (local_40._M_head_impl != (pointer)0x0) {
          (*(code *)((local_40._M_head_impl)->poller_->channels_).
                    super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
                    super__Vector_impl_data._M_start)();
        }
      }
    }
  }
  local_38 = (this->poller_)._M_t.
             super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>._M_t.
             super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
             super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl;
  std::make_unique<Liby::EventQueue,Liby::Poller*>((Poller **)&local_40);
  _Var2._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (EventQueue *)0x0;
  std::__uniq_ptr_impl<Liby::EventQueue,_std::default_delete<Liby::EventQueue>_>::reset
            ((__uniq_ptr_impl<Liby::EventQueue,_std::default_delete<Liby::EventQueue>_> *)
             &this->equeue_,_Var2._M_head_impl);
  std::unique_ptr<Liby::EventQueue,_std::default_delete<Liby::EventQueue>_>::~unique_ptr
            ((unique_ptr<Liby::EventQueue,_std::default_delete<Liby::EventQueue>_> *)&local_40);
  local_38 = (this->poller_)._M_t.
             super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>._M_t.
             super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
             super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl;
  std::make_unique<Liby::TimerQueue,Liby::Poller*>((Poller **)&local_40);
  _Var2._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (EventQueue *)0x0;
  std::__uniq_ptr_impl<Liby::TimerQueue,_std::default_delete<Liby::TimerQueue>_>::reset
            ((__uniq_ptr_impl<Liby::TimerQueue,_std::default_delete<Liby::TimerQueue>_> *)
             &this->tqueue_,(pointer)_Var2._M_head_impl);
  std::unique_ptr<Liby::TimerQueue,_std::default_delete<Liby::TimerQueue>_>::~unique_ptr
            ((unique_ptr<Liby::TimerQueue,_std::default_delete<Liby::TimerQueue>_> *)&local_40);
  return;
}

Assistant:

EventLoop::EventLoop(const std::string &chooser) {
    if (chooser == "POLL") {
        poller_ = std::make_unique<PollerPoll>();
    } else if (chooser == "SELECT") {
        poller_ = std::make_unique<PollerSelect>();
    } else {
#ifdef __linux__
        poller_ = std::make_unique<PollerEpoll>();
#elif defined(__APPLE__)
        poller_ = std::make_unique<PollerKevent>();
#endif
    }

    equeue_ = std::make_unique<EventQueue>(poller_.get());
    tqueue_ = std::make_unique<TimerQueue>(poller_.get());
}